

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_utils.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
vector_utils::add(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                 vector<float,_std::allocator<float>_> *a,vector<float,_std::allocator<float>_> *b)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  ostream *poVar5;
  invalid_argument *this;
  long lVar6;
  ulong uVar7;
  allocator_type local_19;
  
  lVar6 = (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar6 == (long)(b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,lVar6 >> 2,&local_19);
    pfVar1 = (a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar2 = (a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    pfVar3 = (b->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar4 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar7 < (ulong)((long)pfVar2 - (long)pfVar1 >> 2); uVar7 = uVar7 + 1) {
      pfVar4[uVar7] = pfVar1[uVar7] + pfVar3[uVar7];
    }
    return __return_storage_ptr__;
  }
  poVar5 = log_error();
  poVar5 = std::operator<<(poVar5,"[Nelder-Mead] Add operands dimmensions do not match. ");
  poVar5 = std::operator<<(poVar5,"dim(a)=");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5,"; dim(b)=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Operands dimmensions do not match");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::vector<float> vector_utils::add(const std::vector<float> &a, const std::vector<float> &b)
{
  if (a.size() != b.size())
  {
    log_error() << "[Nelder-Mead] Add operands dimmensions do not match. "
      << "dim(a)=" << a.size() << "; dim(b)=" << b.size();
    throw std::invalid_argument("Operands dimmensions do not match");
  }

  std::vector<float> output(a.size());

  for (auto i = 0; i < a.size(); ++i)
  {
    output[i] = a[i] + b[i];
  }

  return output;
}